

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  uint uVar1;
  int iVar2;
  sqlite3_int64 sVar3;
  uint uVar4;
  uint uVar5;
  char *in_RDX;
  uint in_ESI;
  long *in_RDI;
  undefined8 *in_R8;
  char *pcVar6;
  char *zQuery;
  int iCol;
  int iIdx;
  sqlite3_value *pDocidLe;
  sqlite3_value *pDocidGe;
  sqlite3_value *pLangid;
  sqlite3_value *pCons;
  Fts3Cursor *pCsr;
  Fts3Table *p;
  int eSearch;
  char *zSql;
  int rc;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  sqlite3_value *in_stack_ffffffffffffff68;
  sqlite3_stmt *in_stack_ffffffffffffff70;
  Fts3Cursor *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  long lVar7;
  sqlite3_tokenizer *pTokenizer;
  long local_68;
  Fts3Cursor *pCsr_00;
  long *plVar8;
  Fts3Expr **ppExpr;
  undefined4 in_stack_ffffffffffffffb8;
  char *local_40;
  int local_34;
  int local_4;
  
  ppExpr = (Fts3Expr **)*in_RDI;
  pCsr_00 = (Fts3Cursor *)0x0;
  local_68 = 0;
  pTokenizer = (sqlite3_tokenizer *)0x0;
  lVar7 = 0;
  uVar1 = in_ESI & 0xffff;
  if (uVar1 != 0) {
    pCsr_00 = (Fts3Cursor *)*in_R8;
  }
  uVar5 = (uint)(uVar1 != 0);
  uVar4 = uVar5;
  if ((in_ESI & 0x10000) != 0) {
    uVar4 = uVar5 + 1;
    local_68 = in_R8[(int)uVar5];
  }
  uVar5 = uVar4;
  if ((in_ESI & 0x20000) != 0) {
    uVar5 = uVar4 + 1;
    pTokenizer = (sqlite3_tokenizer *)in_R8[(int)uVar4];
  }
  uVar4 = uVar5;
  if ((in_ESI & 0x40000) != 0) {
    uVar4 = uVar5 + 1;
    lVar7 = in_R8[(int)uVar5];
  }
  plVar8 = in_RDI;
  sqlite3_finalize((sqlite3_stmt *)in_stack_ffffffffffffff68);
  sqlite3_free((void *)0x1bb009);
  sqlite3_free((void *)0x1bb017);
  sqlite3Fts3ExprFree((Fts3Expr *)CONCAT44(uVar4,in_stack_ffffffffffffff80));
  memset(in_RDI + 1,0,0x88);
  sVar3 = fts3DocidRange(in_stack_ffffffffffffff68,
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  plVar8[0xc] = sVar3;
  sVar3 = fts3DocidRange(in_stack_ffffffffffffff68,
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  plVar8[0xd] = sVar3;
  if (in_RDX == (char *)0x0) {
    *(undefined1 *)((long)plVar8 + 0x4c) = *(undefined1 *)((long)ppExpr + 0x1bf);
  }
  else {
    *(bool *)((long)plVar8 + 0x4c) = *in_RDX == 'D';
  }
  *(short *)(plVar8 + 1) = (short)uVar1;
  if ((uVar1 != 1) && (uVar1 != 0)) {
    in_stack_ffffffffffffff80 = uVar1 - 2;
    in_stack_ffffffffffffff78 = (Fts3Cursor *)sqlite3_value_text((sqlite3_value *)0x1bb0f8);
    if ((in_stack_ffffffffffffff78 == (Fts3Cursor *)0x0) &&
       (iVar2 = sqlite3_value_type((sqlite3_value *)pCsr_00), iVar2 != 5)) {
      return 7;
    }
    *(undefined4 *)(plVar8 + 4) = 0;
    if (local_68 != 0) {
      iVar2 = sqlite3_value_int((sqlite3_value *)0x1bb142);
      *(int *)(plVar8 + 4) = iVar2;
    }
    in_stack_ffffffffffffff68 = (sqlite3_value *)(plVar8 + 3);
    in_stack_ffffffffffffff70 = (sqlite3_stmt *)(ppExpr + 2);
    in_stack_ffffffffffffff60 = 0xffffffff;
    iVar2 = sqlite3Fts3ExprParse
                      (pTokenizer,(int)((ulong)lVar7 >> 0x20),
                       (char **)CONCAT44(uVar4,in_stack_ffffffffffffff80),
                       (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                       (int)in_stack_ffffffffffffff78,
                       (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(char *)pCsr_00,(int)plVar8,
                       ppExpr,(char **)CONCAT44(uVar1,in_stack_ffffffffffffffb8));
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = fts3EvalStart(pCsr_00);
    sqlite3Fts3SegmentsClose((Fts3Table *)0x1bb1e5);
    if (iVar2 != 0) {
      return iVar2;
    }
    plVar8[7] = plVar8[8];
    plVar8[6] = 0;
  }
  local_34 = 0;
  if (uVar1 == 0) {
    if ((pTokenizer == (sqlite3_tokenizer *)0x0) && (lVar7 == 0)) {
      pcVar6 = "ASC";
      if (*(char *)((long)plVar8 + 0x4c) != '\0') {
        pcVar6 = "DESC";
      }
      local_40 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",ppExpr[0x35],pcVar6);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    }
    else {
      pcVar6 = "ASC";
      if (*(char *)((long)plVar8 + 0x4c) != '\0') {
        pcVar6 = "DESC";
      }
      local_40 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                 ppExpr[0x35],plVar8[0xc],plVar8[0xd],pcVar6);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    }
    if (local_40 == (char *)0x0) {
      local_34 = 7;
    }
    else {
      local_34 = sqlite3_prepare_v2((sqlite3 *)CONCAT44(uVar4,in_stack_ffffffffffffff80),
                                    (char *)in_stack_ffffffffffffff78,iVar2,
                                    (sqlite3_stmt **)in_stack_ffffffffffffff68,
                                    (char **)CONCAT44(in_stack_ffffffffffffff64,
                                                      in_stack_ffffffffffffff60));
      sqlite3_free((void *)0x1bb300);
    }
  }
  else if ((uVar1 == 1) &&
          (local_34 = fts3CursorSeekStmt(in_stack_ffffffffffffff78,
                                         (sqlite3_stmt **)in_stack_ffffffffffffff70), local_34 == 0)
          ) {
    local_34 = sqlite3_bind_value(in_stack_ffffffffffffff70,
                                  (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                  (sqlite3_value *)
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  if (local_34 == 0) {
    local_4 = fts3NextMethod((sqlite3_vtab_cursor *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  else {
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr->aDoclist);
  sqlite3_free(pCsr->aMatchinfo);
  sqlite3Fts3ExprFree(pCsr->pExpr);
  memset(&pCursor[1], 0, sizeof(Fts3Cursor)-sizeof(sqlite3_vtab_cursor));

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v2(p->db, zSql, -1, &pCsr->pStmt, 0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr, &pCsr->pStmt);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}